

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O0

ostream * pstack::operator<<(ostream *os,JSON<pstack::Dwarf::Info,_char> *di)

{
  JObject *this;
  list<pstack::Dwarf::PubnameUnit,_std::allocator<pstack::Dwarf::PubnameUnit>_> *v;
  ostream *poVar1;
  char local_61;
  CFI *local_60;
  CFI *ehFrame;
  CFI *local_50;
  CFI *debugFrame;
  undefined1 local_38 [24];
  JObject writer;
  JSON<pstack::Dwarf::Info,_char> *di_local;
  ostream *os_local;
  
  writer.sep = (char *)di;
  JObject::JObject((JObject *)(local_38 + 0x10),os);
  Dwarf::Info::getUnits((Info *)local_38);
  debugFrame._3_1_ = 0;
  this = JObject::field<char[6],pstack::Dwarf::Units,char>
                   ((JObject *)(local_38 + 0x10),(char (*) [6])"units",(Units *)local_38,
                    (char *)((long)&debugFrame + 3));
  v = Dwarf::Info::pubnames_abi_cxx11_(*(Info **)writer.sep);
  debugFrame._2_1_ = 0;
  JObject::
  field<char[13],std::__cxx11::list<pstack::Dwarf::PubnameUnit,std::allocator<pstack::Dwarf::PubnameUnit>>,char>
            (this,(char (*) [13])"pubnameUnits",v,(char *)((long)&debugFrame + 2));
  Dwarf::Units::~Units((Units *)local_38);
  local_50 = Dwarf::Info::getCFI(*(Info **)writer.sep,FI_DEBUG_FRAME);
  if (local_50 != (CFI *)0x0) {
    ehFrame._7_1_ = 0;
    JObject::field<char[11],pstack::Dwarf::CFI,char>
              ((JObject *)(local_38 + 0x10),(char (*) [11])"debugframe",local_50,
               (char *)((long)&ehFrame + 7));
  }
  local_60 = Dwarf::Info::getCFI(*(Info **)writer.sep,FI_EH_FRAME);
  local_61 = '\0';
  JObject::field<char[8],pstack::Dwarf::CFI,char>
            ((JObject *)(local_38 + 0x10),(char (*) [8])"ehFrame",local_60,&local_61);
  poVar1 = JObject::operator_cast_to_ostream_((JObject *)(local_38 + 0x10));
  JObject::~JObject((JObject *)(local_38 + 0x10));
  return poVar1;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Dwarf::Info> &di)
{
    JObject writer(os);
    writer.field("units", di.object.getUnits())
        .field("pubnameUnits", di.object.pubnames())
        ; // XXX .field("aranges", di->getARanges());

    auto debugFrame = di.object.getCFI( Dwarf::FI_DEBUG_FRAME );
    if (debugFrame)
        writer.field("debugframe", *debugFrame);
    auto ehFrame = di.object.getCFI( Dwarf::FI_EH_FRAME );
        writer.field("ehFrame", *ehFrame);
    return writer;
}